

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_util_tracesnap(lua_State *L)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  SnapShot *pSVar4;
  SnapEntry *pSVar5;
  uint uVar6;
  GCtrace *pGVar7;
  TValue *pTVar8;
  int iVar9;
  ulong uVar10;
  uint narray;
  long lVar11;
  GCtab *t;
  
  pGVar7 = jit_checktrace(L);
  uVar6 = lj_lib_checkint(L,2);
  iVar9 = 0;
  if ((pGVar7 != (GCtrace *)0x0) && (uVar6 < pGVar7->nsnap)) {
    pSVar4 = pGVar7->snap;
    uVar3 = pSVar4[uVar6].mapofs;
    pSVar5 = pGVar7->snapmap;
    bVar2 = pSVar4[uVar6].nent;
    lVar1 = (ulong)bVar2 + 2;
    narray = (uint)lVar1;
    lua_createtable(L,narray,0);
    t = (GCtab *)(ulong)L->top[-1].u32.lo;
    if (t->asize == 0) {
      pTVar8 = lj_tab_setinth(L,t,0);
    }
    else {
      pTVar8 = (TValue *)(ulong)(t->array).ptr32;
    }
    pTVar8->n = (double)(int)(pSVar4[uVar6].ref - 0x8000);
    if (t->asize < 2) {
      pTVar8 = lj_tab_setinth(L,t,1);
    }
    else {
      pTVar8 = (TValue *)((ulong)(t->array).ptr32 + 8);
    }
    pTVar8->n = (double)pSVar4[uVar6].nslots;
    lVar11 = 0x10;
    for (uVar10 = 0; bVar2 != uVar10; uVar10 = uVar10 + 1) {
      if (uVar10 + 2 < (ulong)t->asize) {
        pTVar8 = (TValue *)((ulong)(t->array).ptr32 + lVar11);
      }
      else {
        pTVar8 = lj_tab_setinth(L,t,(int)uVar10 + 2);
      }
      pTVar8->n = (double)(int)pSVar5[uVar3 + uVar10];
      lVar11 = lVar11 + 8;
    }
    if (narray < t->asize) {
      pTVar8 = (TValue *)((ulong)(t->array).ptr32 + lVar1 * 8);
    }
    else {
      pTVar8 = lj_tab_setinth(L,t,narray);
    }
    pTVar8->u64 = 0xc170000000000000;
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

LJLIB_CF(jit_util_tracesnap)
{
  GCtrace *T = jit_checktrace(L);
  SnapNo sn = (SnapNo)lj_lib_checkint(L, 2);
  if (T && sn < T->nsnap) {
    SnapShot *snap = &T->snap[sn];
    SnapEntry *map = &T->snapmap[snap->mapofs];
    MSize n, nent = snap->nent;
    GCtab *t;
    lua_createtable(L, nent+2, 0);
    t = tabV(L->top-1);
    setintV(lj_tab_setint(L, t, 0), (int32_t)snap->ref - REF_BIAS);
    setintV(lj_tab_setint(L, t, 1), (int32_t)snap->nslots);
    for (n = 0; n < nent; n++)
      setintV(lj_tab_setint(L, t, (int32_t)(n+2)), (int32_t)map[n]);
    setintV(lj_tab_setint(L, t, (int32_t)(nent+2)), (int32_t)SNAP(255, 0, 0));
    return 1;
  }
  return 0;
}